

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O1

int mpt_library_detach(mpt_libhandle **handle)

{
  mpt_libhandle *__ptr;
  uintptr_t uVar1;
  int iVar2;
  
  __ptr = *handle;
  if ((__ptr != (mpt_libhandle *)0x0) &&
     ((uVar1 = (__ptr->_ref)._val, uVar1 == 0 || ((__ptr->_ref)._val = uVar1 - 1, uVar1 - 1 == 0))))
  {
    if ((__ptr->addr != (void *)0x0) && (iVar2 = dlclose(), iVar2 < 0)) {
      return -4;
    }
    if (uVar1 != 0) {
      free(__ptr);
    }
    *handle = (mpt_libhandle *)0x0;
  }
  return 0;
}

Assistant:

extern int mpt_library_detach(MPT_STRUCT(libhandle) **handle)
{
	MPT_STRUCT(libhandle) *lh;
	uintptr_t count;
	
	if (!(lh = *handle)) {
		return 0;
	}
	if ((count = lh->_ref._val)
	    && __mpt_library_proxy_unref(&lh->_ref)) {
		return 0;
	}
	if (lh->addr && dlclose(lh->addr) < 0) {
		return MPT_ERROR(BadOperation);
	}
	if (count) {
		free(lh);
	}
	*handle = 0;
	return 0;
}